

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

uint ext_u16n(uint16_t *a,size_t n)

{
  uint uVar1;
  long lVar2;
  size_t i;
  bool bVar3;
  
  lVar2 = 0;
  uVar1 = 0;
  while( true ) {
    bVar3 = n == 0;
    n = n - 1;
    if ((bVar3) || (lVar2 == 0x20)) break;
    uVar1 = uVar1 + ((uint)a[n] << ((byte)lVar2 & 0x1f));
    lVar2 = lVar2 + 0x10;
  }
  return uVar1;
}

Assistant:

static unsigned int ext_u16n(const uint16_t *a, size_t n)
{
	unsigned int result = 0;
	size_t i = n;
	size_t rb = sizeof(unsigned int) * CHAR_BIT;
	size_t shift = 0;

	while (1) {
		if (i == 0 || rb == 0) {
			break;
		}
		--i;
		if (rb < 16) {
			result += (a[i] & ((1U << rb) - 1)) << shift;
			break;
		}
		result += (unsigned int)a[i] << shift;
		rb -= 16;
		shift += 16;
	}
	return result;
}